

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceSDL.cpp
# Opt level: O1

void __thiscall irr::CIrrDeviceSDL::createDriver(CIrrDeviceSDL *this)

{
  SIrrlichtCreationParameters *params;
  E_DRIVER_TYPE EVar1;
  CSDLManager *this_00;
  IVideoDriver *pIVar2;
  char *this_01;
  double __x;
  double extraout_XMM0_Qa;
  double __x_00;
  double extraout_XMM0_Qa_00;
  
  if ((this->super_CIrrDeviceStub).CreationParams.DriverType == EDT_NULL) {
    pIVar2 = video::createNullDriver
                       ((this->super_CIrrDeviceStub).FileSystem,
                        &(this->super_CIrrDeviceStub).CreationParams.WindowSize);
    *(IVideoDriver **)&(this->super_CIrrDeviceStub).super_IrrlichtDevice.field_0x8 = pIVar2;
    return;
  }
  this_00 = (CSDLManager *)operator_new(0x48);
  video::CSDLManager::CSDLManager(this_00,this);
  (this->super_CIrrDeviceStub).ContextManager = (IContextManager *)this_00;
  EVar1 = (this->super_CIrrDeviceStub).CreationParams.DriverType;
  __x_00 = __x;
  if (4 < EVar1 - EDT_OPENGL) goto switchD_0020c9ab_caseD_2;
  params = &(this->super_CIrrDeviceStub).CreationParams;
  switch(EVar1) {
  case EDT_OPENGL:
    pIVar2 = video::createOpenGLDriver
                       (params,(this->super_CIrrDeviceStub).FileSystem,(IContextManager *)this_00);
    __x_00 = extraout_XMM0_Qa;
    break;
  case EDT_OGLES1:
    goto switchD_0020c9ab_caseD_2;
  case EDT_OGLES2:
    this_01 = "No OpenGL ES 2 support compiled in.";
    goto LAB_0020c9e1;
  case EDT_WEBGL1:
    this_01 = "No WebGL 1 support compiled in.";
LAB_0020c9e1:
    __x_00 = os::Printer::log((Printer *)this_01,__x);
    pIVar2 = (IVideoDriver *)0x0;
    break;
  case EDT_OPENGL3:
    pIVar2 = video::createOpenGL3Driver
                       ((video *)params,
                        (SIrrlichtCreationParameters *)(this->super_CIrrDeviceStub).FileSystem,
                        (IFileSystem *)this_00,
                        (IContextManager *)&switchD_0020c9ab::switchdataD_0023846c);
    __x_00 = extraout_XMM0_Qa_00;
  }
  *(IVideoDriver **)&(this->super_CIrrDeviceStub).super_IrrlichtDevice.field_0x8 = pIVar2;
switchD_0020c9ab_caseD_2:
  if (*(long *)&(this->super_CIrrDeviceStub).super_IrrlichtDevice.field_0x8 != 0) {
    return;
  }
  os::Printer::log((Printer *)"Could not create video driver",__x_00);
  return;
}

Assistant:

void CIrrDeviceSDL::createDriver()
{
	if (CreationParams.DriverType == video::EDT_NULL) {
		VideoDriver = video::createNullDriver(FileSystem, CreationParams.WindowSize);
		return;
	}

	ContextManager = new video::CSDLManager(this);
	switch (CreationParams.DriverType) {
	case video::EDT_OPENGL:
		VideoDriver = video::createOpenGLDriver(CreationParams, FileSystem, ContextManager);
		break;
	case video::EDT_OPENGL3:
		VideoDriver = video::createOpenGL3Driver(CreationParams, FileSystem, ContextManager);
		break;
	case video::EDT_OGLES2:
		VideoDriver = video::createOGLES2Driver(CreationParams, FileSystem, ContextManager);
		break;
	case video::EDT_WEBGL1:
		VideoDriver = video::createWebGL1Driver(CreationParams, FileSystem, ContextManager);
		break;
	default:;
	}
	if (!VideoDriver)
		os::Printer::log("Could not create video driver", ELL_ERROR);
}